

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

PropertyIndex __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::GetPropertyIndex
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          PropertyRecord *propertyRecord)

{
  PropertyIndex PVar1;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  PVar1 = GetPropertyIndex_Internal<false>(this,propertyRecord);
  return PVar1;
}

Assistant:

PropertyIndex SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyIndex(const PropertyRecord* propertyRecord)
    {
        return this->GetPropertyIndex_Internal<false>(propertyRecord);
    }